

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O2

Dae * __thiscall opencollada::Dae::operator=(Dae *this,Dae *other)

{
  XmlDoc::operator=(&this->super_XmlDoc,&other->super_XmlDoc);
  Uri::operator=(&this->mUri,&other->mUri);
  ::std::
  _Rb_tree<opencollada::Uri,_std::pair<const_opencollada::Uri,_opencollada::Dae>,_std::_Select1st<std::pair<const_opencollada::Uri,_opencollada::Dae>_>,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
  ::operator=(&(this->mExternalDAEs)._M_t,&(other->mExternalDAEs)._M_t);
  return this;
}

Assistant:

const Dae & Dae::operator = (Dae && other)
	{
		this->XmlDoc::operator=(std::move(other));
		mUri = std::move(other.mUri);
		mExternalDAEs = std::move(other.mExternalDAEs);
		return *this;
	}